

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O1

void __thiscall CSocekt::zdClosesocketProc(CSocekt *this,lp_connection_t p_Conn)

{
  int iVar1;
  
  if (this->m_ifkickTimeCount == 1) {
    DeleteFromTimerQueue(this,p_Conn);
  }
  if (p_Conn->fd != -1) {
    close(p_Conn->fd);
    p_Conn->fd = -1;
  }
  LOCK();
  iVar1 = (p_Conn->iThrowsendCount).value_;
  if (iVar1 == 0) {
    (p_Conn->iThrowsendCount).value_ = 0;
    iVar1 = 0;
  }
  UNLOCK();
  if (0 < iVar1) {
    LOCK();
    (p_Conn->iThrowsendCount).value_ = (p_Conn->iThrowsendCount).value_ + -1;
    UNLOCK();
  }
  inRecyConnectQueue(this,p_Conn);
  return;
}

Assistant:

void CSocekt::zdClosesocketProc(lp_connection_t p_Conn)
{
    if(m_ifkickTimeCount == 1)
    {
        DeleteFromTimerQueue(p_Conn); //从时间队列中把连接干掉
    }
    if(p_Conn->fd != -1)
    {   
        close(p_Conn->fd); //这个socket关闭，关闭后epoll就会被从红黑树中删除，所以这之后无法收到任何epoll事件
        p_Conn->fd = -1;
    }

    if(p_Conn->iThrowsendCount.get() > 0)  
        p_Conn->iThrowsendCount.decrement();   //归0

    inRecyConnectQueue(p_Conn);
    return;
}